

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O3

TRANSPORT_LL_HANDLE
IoTHubTransport_MQTT_Common_Create
          (IOTHUBTRANSPORT_CONFIG *config,MQTT_GET_IO_TRANSPORT get_io_transport,
          TRANSPORT_CALLBACKS_INFO *cb_info,void *ctx)

{
  IOTHUB_CLIENT_CONFIG *pIVar1;
  char *pcVar2;
  int iVar3;
  LOGGER_LOG p_Var4;
  size_t sVar5;
  PMQTTTRANSPORT_HANDLE_DATA pMVar6;
  long lVar7;
  TRANSPORT_CALLBACKS_INFO *pTVar8;
  char *pcVar9;
  byte bVar10;
  
  bVar10 = 0;
  if ((get_io_transport == (MQTT_GET_IO_TRANSPORT)0x0 || config == (IOTHUBTRANSPORT_CONFIG *)0x0) ||
      cb_info == (TRANSPORT_CALLBACKS_INFO *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Create",0xc90,1,
                "Invalid Argument config: %p, get_io_transport: %p, cb_info: %p",config,
                get_io_transport,cb_info);
      return (TRANSPORT_LL_HANDLE)0x0;
    }
  }
  else if (config->auth_module_handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar9 = "Invalid Argument: auth_module_handle is NULL)";
      iVar3 = 0xc95;
LAB_0012aa44:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Create",iVar3,1,pcVar9);
      return (TRANSPORT_LL_HANDLE)0x0;
    }
  }
  else {
    pIVar1 = config->upperConfig;
    if (((((pIVar1 == (IOTHUB_CLIENT_CONFIG *)0x0) ||
          (pIVar1->protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0)) ||
         (pIVar1->deviceId == (char *)0x0)) ||
        ((pcVar9 = pIVar1->deviceKey, pcVar9 != (char *)0x0 &&
         (pIVar1->deviceSasToken != (char *)0x0)))) ||
       ((pcVar2 = pIVar1->iotHubName, pcVar2 == (char *)0x0 || (pIVar1->iotHubSuffix == (char *)0x0)
        ))) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar9 = "Invalid Argument: upperConfig structure contains an invalid parameter";
        iVar3 = 0xc9f;
        goto LAB_0012aa44;
      }
    }
    else if (config->waitingToSend == (PDLIST_ENTRY)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar9 = "Invalid Argument: waitingToSend is NULL)";
        iVar3 = 0xca4;
        goto LAB_0012aa44;
      }
    }
    else {
      sVar5 = strlen(pIVar1->deviceId);
      if (sVar5 - 0x81 < 0xffffffffffffff80) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar9 = "Invalid Argument: DeviceId is of an invalid size";
          iVar3 = 0xca9;
          goto LAB_0012aa44;
        }
      }
      else if ((pcVar9 == (char *)0x0) || (*pcVar9 != '\0')) {
        if ((pIVar1->deviceSasToken == (char *)0x0) || (*pIVar1->deviceSasToken != '\0')) {
          if (*pcVar2 == '\0') {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              pcVar9 = "Invalid Argument: iotHubName is empty";
              iVar3 = 0xcb8;
              goto LAB_0012aa44;
            }
          }
          else {
            iVar3 = IoTHub_Transport_ValidateCallbacks(cb_info);
            if (iVar3 == 0) {
              pMVar6 = InitializeTransportHandleData
                                 (config->upperConfig,config->waitingToSend,
                                  config->auth_module_handle,config->moduleId);
              if (pMVar6 != (PMQTTTRANSPORT_HANDLE_DATA)0x0) {
                pMVar6->get_io_transport = get_io_transport;
                pMVar6->http_proxy_hostname = (char *)0x0;
                pMVar6->http_proxy_username = (char *)0x0;
                pMVar6->http_proxy_password = (char *)0x0;
                pMVar6->transport_ctx = ctx;
                pTVar8 = &pMVar6->transport_callbacks;
                for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
                  pTVar8->msg_input_cb = cb_info->msg_input_cb;
                  cb_info = (TRANSPORT_CALLBACKS_INFO *)((long)cb_info + (ulong)bVar10 * -0x10 + 8);
                  pTVar8 = (TRANSPORT_CALLBACKS_INFO *)((long)pTVar8 + (ulong)bVar10 * -0x10 + 8);
                }
                return pMVar6;
              }
            }
            else {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                pcVar9 = "failure checking transport callbacks";
                iVar3 = 0xcbd;
                goto LAB_0012aa44;
              }
            }
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            pcVar9 = "Invalid Argument: deviceSasToken is empty";
            iVar3 = 0xcb3;
            goto LAB_0012aa44;
          }
        }
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar9 = "Invalid Argument: deviceKey is empty";
          iVar3 = 0xcae;
          goto LAB_0012aa44;
        }
      }
    }
  }
  return (TRANSPORT_LL_HANDLE)0x0;
}

Assistant:

TRANSPORT_LL_HANDLE IoTHubTransport_MQTT_Common_Create(const IOTHUBTRANSPORT_CONFIG* config, MQTT_GET_IO_TRANSPORT get_io_transport, TRANSPORT_CALLBACKS_INFO* cb_info, void* ctx)
{
    PMQTTTRANSPORT_HANDLE_DATA result;
    size_t deviceIdSize;

    if (config == NULL || get_io_transport == NULL || cb_info == NULL)
    {
        LogError("Invalid Argument config: %p, get_io_transport: %p, cb_info: %p", config, get_io_transport, cb_info);
        result = NULL;
    }
    else if (config->auth_module_handle == NULL)
    {
        LogError("Invalid Argument: auth_module_handle is NULL)");
        result = NULL;
    }
    else if (config->upperConfig == NULL ||
        config->upperConfig->protocol == NULL ||
        config->upperConfig->deviceId == NULL ||
        ((config->upperConfig->deviceKey != NULL) && (config->upperConfig->deviceSasToken != NULL)) ||
        config->upperConfig->iotHubName == NULL ||
        config->upperConfig->iotHubSuffix == NULL)
    {
        LogError("Invalid Argument: upperConfig structure contains an invalid parameter");
        result = NULL;
    }
    else if (config->waitingToSend == NULL)
    {
        LogError("Invalid Argument: waitingToSend is NULL)");
        result = NULL;
    }
    else if (((deviceIdSize = strlen(config->upperConfig->deviceId)) > 128U) || (deviceIdSize == 0))
    {
        LogError("Invalid Argument: DeviceId is of an invalid size");
        result = NULL;
    }
    else if ((config->upperConfig->deviceKey != NULL) && (strlen(config->upperConfig->deviceKey) == 0))
    {
        LogError("Invalid Argument: deviceKey is empty");
        result = NULL;
    }
    else if ((config->upperConfig->deviceSasToken != NULL) && (strlen(config->upperConfig->deviceSasToken) == 0))
    {
        LogError("Invalid Argument: deviceSasToken is empty");
        result = NULL;
    }
    else if (strlen(config->upperConfig->iotHubName) == 0)
    {
        LogError("Invalid Argument: iotHubName is empty");
        result = NULL;
    }
    else if (IoTHub_Transport_ValidateCallbacks(cb_info) != 0)
    {
        LogError("failure checking transport callbacks");
        result = NULL;
    }
    else
    {
        result = InitializeTransportHandleData(config->upperConfig, config->waitingToSend, config->auth_module_handle, config->moduleId);
        if (result != NULL)
        {
            result->get_io_transport = get_io_transport;
            result->http_proxy_hostname = NULL;
            result->http_proxy_username = NULL;
            result->http_proxy_password = NULL;

            result->transport_ctx = ctx;
            memcpy(&result->transport_callbacks, cb_info, sizeof(TRANSPORT_CALLBACKS_INFO));
        }
    }
    return result;
}